

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_converter.cc
# Opt level: O1

unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_> __thiscall
webrtc::AudioConverter::Create
          (AudioConverter *this,size_t src_channels,size_t src_frames,size_t dst_channels,
          size_t dst_frames)

{
  ResampleConverter *pRVar1;
  undefined **ppuVar2;
  AudioConverter *this_00;
  CompositionConverter *pCVar3;
  pointer *__ptr;
  vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
  *this_01;
  vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
  converters;
  _Head_base<0UL,_webrtc::AudioConverter_*,_false> local_80;
  vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
  local_78;
  vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
  local_60;
  vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
  local_48;
  
  this->_vptr_AudioConverter = (_func_int **)0x0;
  if (dst_channels < src_channels) {
    if (src_frames != dst_frames) {
      local_78.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_00 = (AudioConverter *)operator_new(0x28);
      AudioConverter(this_00,src_channels,src_frames,dst_channels,src_frames);
      this_00->_vptr_AudioConverter = (_func_int **)&PTR__AudioConverter_001cf950;
      local_80._M_head_impl = this_00;
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>,std::allocator<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>>
      ::
      emplace_back<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>
                ((vector<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>,std::allocator<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>>
                  *)&local_78,
                 (unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_> *
                 )&local_80);
      if (local_80._M_head_impl != (AudioConverter *)0x0) {
        (*(local_80._M_head_impl)->_vptr_AudioConverter[1])();
      }
      pRVar1 = (ResampleConverter *)operator_new(0x40);
      ResampleConverter::ResampleConverter(pRVar1,dst_channels,src_frames,dst_channels,dst_frames);
      local_80._M_head_impl = (AudioConverter *)pRVar1;
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>,std::allocator<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>>
      ::
      emplace_back<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>
                ((vector<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>,std::allocator<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>>
                  *)&local_78,
                 (unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_> *
                 )&local_80);
      if ((ResampleConverter *)local_80._M_head_impl != (ResampleConverter *)0x0) {
        (*((AudioConverter *)&(local_80._M_head_impl)->_vptr_AudioConverter)->_vptr_AudioConverter
          [1])();
      }
      pCVar3 = (CompositionConverter *)operator_new(0x58);
      local_48.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_78.
           super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_48.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_78.
           super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_48.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_78.
           super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_78.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      CompositionConverter::CompositionConverter(pCVar3,&local_48);
      this->_vptr_AudioConverter = (_func_int **)pCVar3;
      this_01 = &local_48;
LAB_00140ca1:
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ::~vector(this_01);
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ::~vector(&local_78);
      return (__uniq_ptr_data<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>,_true,_true>
              )(__uniq_ptr_data<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>,_true,_true>
                )this;
    }
    pRVar1 = (ResampleConverter *)operator_new(0x28);
    AudioConverter((AudioConverter *)pRVar1,src_channels,src_frames,dst_channels,dst_frames);
    ppuVar2 = &PTR__AudioConverter_001cf950;
  }
  else if (src_channels < dst_channels) {
    if (src_frames != dst_frames) {
      local_78.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pRVar1 = (ResampleConverter *)operator_new(0x40);
      ResampleConverter::ResampleConverter(pRVar1,src_channels,src_frames,src_channels,dst_frames);
      local_80._M_head_impl = (AudioConverter *)pRVar1;
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>,std::allocator<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>>
      ::
      emplace_back<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>
                ((vector<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>,std::allocator<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>>
                  *)&local_78,
                 (unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_> *
                 )&local_80);
      if ((ResampleConverter *)local_80._M_head_impl != (ResampleConverter *)0x0) {
        (*((AudioConverter *)&(local_80._M_head_impl)->_vptr_AudioConverter)->_vptr_AudioConverter
          [1])();
      }
      pRVar1 = (ResampleConverter *)operator_new(0x28);
      AudioConverter((AudioConverter *)pRVar1,src_channels,dst_frames,dst_channels,dst_frames);
      (pRVar1->super_AudioConverter)._vptr_AudioConverter =
           (_func_int **)&PTR__AudioConverter_001cfa10;
      local_80._M_head_impl = (AudioConverter *)pRVar1;
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>,std::allocator<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>>
      ::
      emplace_back<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>
                ((vector<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>,std::allocator<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>>
                  *)&local_78,
                 (unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_> *
                 )&local_80);
      if ((ResampleConverter *)local_80._M_head_impl != (ResampleConverter *)0x0) {
        (*((AudioConverter *)&(local_80._M_head_impl)->_vptr_AudioConverter)->_vptr_AudioConverter
          [1])();
      }
      pCVar3 = (CompositionConverter *)operator_new(0x58);
      local_60.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_78.
           super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_60.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_78.
           super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_60.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_78.
           super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_78.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      CompositionConverter::CompositionConverter(pCVar3,&local_60);
      this->_vptr_AudioConverter = (_func_int **)pCVar3;
      this_01 = &local_60;
      goto LAB_00140ca1;
    }
    pRVar1 = (ResampleConverter *)operator_new(0x28);
    AudioConverter((AudioConverter *)pRVar1,src_channels,src_frames,dst_channels,dst_frames);
    ppuVar2 = &PTR__AudioConverter_001cfa10;
  }
  else {
    if (src_frames != dst_frames) {
      pRVar1 = (ResampleConverter *)operator_new(0x40);
      ResampleConverter::ResampleConverter(pRVar1,src_channels,src_frames,dst_channels,dst_frames);
      goto LAB_00140bb3;
    }
    pRVar1 = (ResampleConverter *)operator_new(0x28);
    AudioConverter((AudioConverter *)pRVar1,src_channels,src_frames,dst_channels,dst_frames);
    ppuVar2 = &PTR__AudioConverter_001cfa50;
  }
  (pRVar1->super_AudioConverter)._vptr_AudioConverter = (_func_int **)ppuVar2;
LAB_00140bb3:
  this->_vptr_AudioConverter = (_func_int **)pRVar1;
  return (__uniq_ptr_data<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>,_true,_true>
          )(__uniq_ptr_data<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<AudioConverter> AudioConverter::Create(size_t src_channels,
                                                       size_t src_frames,
                                                       size_t dst_channels,
                                                       size_t dst_frames) {
  std::unique_ptr<AudioConverter> sp;
  if (src_channels > dst_channels) {
    if (src_frames != dst_frames) {
      std::vector<std::unique_ptr<AudioConverter>> converters;
      converters.push_back(std::unique_ptr<AudioConverter>(new DownmixConverter(
          src_channels, src_frames, dst_channels, src_frames)));
      converters.push_back(
          std::unique_ptr<AudioConverter>(new ResampleConverter(
              dst_channels, src_frames, dst_channels, dst_frames)));
      sp.reset(new CompositionConverter(std::move(converters)));
    } else {
      sp.reset(new DownmixConverter(src_channels, src_frames, dst_channels,
                                    dst_frames));
    }
  } else if (src_channels < dst_channels) {
    if (src_frames != dst_frames) {
      std::vector<std::unique_ptr<AudioConverter>> converters;
      converters.push_back(
          std::unique_ptr<AudioConverter>(new ResampleConverter(
              src_channels, src_frames, src_channels, dst_frames)));
      converters.push_back(std::unique_ptr<AudioConverter>(new UpmixConverter(
          src_channels, dst_frames, dst_channels, dst_frames)));
      sp.reset(new CompositionConverter(std::move(converters)));
    } else {
      sp.reset(new UpmixConverter(src_channels, src_frames, dst_channels,
                                  dst_frames));
    }
  } else if (src_frames != dst_frames) {
    sp.reset(new ResampleConverter(src_channels, src_frames, dst_channels,
                                   dst_frames));
  } else {
    sp.reset(new CopyConverter(src_channels, src_frames, dst_channels,
                               dst_frames));
  }

  return sp;
}